

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O0

BackendStateWordRef __thiscall snmalloc::MetaEntryBase::get_backend_word(MetaEntryBase *this,Word w)

{
  bool bVar1;
  int in_ESI;
  MetaEntryBase *in_RDI;
  MetaEntryBase *local_28;
  BackendStateWordRef local_8;
  
  bVar1 = is_backend_owned(in_RDI);
  local_28 = in_RDI;
  if (!bVar1) {
    claim_for_backend(in_RDI);
    local_28 = in_RDI;
  }
  if (in_ESI != 0) {
    local_28 = (MetaEntryBase *)&local_28->remote_and_sizeclass;
  }
  BackendStateWordRef::BackendStateWordRef(&local_8,&local_28->meta);
  return (BackendStateWordRef)local_8.val;
}

Assistant:

BackendStateWordRef get_backend_word(Word w)
    {
      if (!is_backend_owned())
      {
        SNMALLOC_ASSERT_MSG(
          is_unowned(),
          "Meta entry is owned by the front end.  Meta: {}, "
          "remote_and_sizeclass:{}",
          meta,
          remote_and_sizeclass);
        claim_for_backend();
      }
      return {w == Word::One ? &meta : &remote_and_sizeclass};
    }